

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std.cpp
# Opt level: O2

int lib_atoi_adv(char **str,size_t *len)

{
  char cVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  
  sVar4 = *len;
  iVar3 = 1;
  iVar2 = 0;
  if (sVar4 == 0) {
    sVar4 = 0;
    iVar2 = 0;
  }
  else {
    cVar1 = **str;
    if (cVar1 == '-') {
      iVar3 = -1;
    }
    else if (cVar1 != '+') goto LAB_0022688c;
    *str = *str + 1;
    sVar4 = *len - 1;
    *len = sVar4;
    iVar2 = 0;
  }
LAB_0022688c:
  while (sVar4 != 0) {
    uVar5 = (int)**str - 0x30;
    if (9 < uVar5) break;
    *str = *str + 1;
    sVar4 = *len - 1;
    *len = sVar4;
    iVar2 = uVar5 + iVar2 * 10;
  }
  return iVar2 * iVar3;
}

Assistant:

int lib_atoi_adv(const char *&str, size_t &len)
{
    /* parse the sign, if present */
    int s = 1;
    if (len >= 1 && *str == '-')
        s = -1, ++str, --len;
    else if (len >= 1 && *str == '+')
        ++str, --len;

    /* scan digits */
    int acc;
    for (acc = 0 ; len > 0 && is_digit(*str) ;
         acc *= 10, acc += value_of_digit(*str), ++str, --len) ;

    /* apply the sign and return the result */
    return s * acc;
}